

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_Read_single(UA_Server *server,UA_Session *session,UA_TimestampsToReturn timestamps,
                        UA_ReadValueId *id,UA_DataValue *v)

{
  UA_Node *server_00;
  size_t sVar1;
  long *plVar2;
  void *pvVar3;
  undefined1 uVar4;
  byte bVar5;
  UA_StatusCode UVar6;
  UA_NodeStoreEntry **ppUVar7;
  UA_DataType *pUVar8;
  UA_DateTime UVar9;
  UA_NodeStoreEntry *pUVar10;
  UA_DataValue *v_00;
  undefined1 local_38 [8];
  timeval tv;
  
  sVar1 = (id->dataEncoding).name.length;
  if ((sVar1 != 0) &&
     ((sVar1 != 0xe ||
      (plVar2 = (long *)(id->dataEncoding).name.data,
      *(long *)((long)plVar2 + 6) != 0x7972616e69422074 || *plVar2 != 0x20746c7561666544)))) {
    *(byte *)v = *(byte *)v | 2;
    v->status = 0x80390000;
    return;
  }
  if (((id->indexRange).length != 0) && (id->attributeId != 0xd)) {
    *(byte *)v = *(byte *)v | 2;
    v->status = 0x80370000;
    return;
  }
  v_00 = v;
  ppUVar7 = findNode(server->nodestore,&id->nodeId);
  if (ppUVar7 == (UA_NodeStoreEntry **)0x0) {
    *(byte *)v = *(byte *)v | 2;
    v->status = 0x80340000;
    return;
  }
  UVar6 = 0x80350000;
  if (0x15 < id->attributeId - 1) goto LAB_0011f18d;
  pUVar10 = *ppUVar7;
  server_00 = &pUVar10->node;
  switch(id->attributeId) {
  case 1:
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    (v->value).type = (UA_DataType *)0x13e6b0;
    (v->value).data = server_00;
    goto LAB_0011f1c1;
  case 2:
    pUVar10 = (UA_NodeStoreEntry *)&(pUVar10->node).nodeClass;
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar8 = (UA_DataType *)0x13efb0;
    break;
  case 3:
    pUVar10 = (UA_NodeStoreEntry *)&(pUVar10->node).browseName;
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar8 = (UA_DataType *)0x13e740;
    break;
  case 4:
    pUVar10 = (UA_NodeStoreEntry *)&(pUVar10->node).displayName;
    goto LAB_0011f041;
  case 5:
    pUVar10 = (UA_NodeStoreEntry *)&(pUVar10->node).description;
    goto LAB_0011f041;
  case 6:
    pUVar10 = (UA_NodeStoreEntry *)&(pUVar10->node).writeMask;
    goto LAB_0011f12b;
  case 7:
    pUVar10 = (UA_NodeStoreEntry *)&(pUVar10->node).userWriteMask;
LAB_0011f12b:
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar8 = (UA_DataType *)0x13e4d0;
    break;
  case 8:
    UVar6 = readIsAbstractAttribute(server_00,&v->value);
    goto LAB_0011f069;
  case 9:
    uVar4 = (char)(pUVar10->node).nodeClass & UA_NODECLASS_REFERENCETYPE;
    goto joined_r0x0011f0e9;
  case 10:
    if (((pUVar10->node).nodeClass & UA_NODECLASS_REFERENCETYPE) == UA_NODECLASS_UNSPECIFIED)
    goto LAB_0011f18d;
    pUVar10 = (UA_NodeStoreEntry *)&pUVar10[1].node;
LAB_0011f041:
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar8 = (UA_DataType *)0x13e770;
    break;
  case 0xb:
    uVar4 = (char)(pUVar10->node).nodeClass & UA_NODECLASS_VIEW;
    goto joined_r0x0011f0e9;
  case 0xc:
    if (((pUVar10->node).nodeClass & (UA_NODECLASS_VIEW|UA_NODECLASS_OBJECT)) ==
        UA_NODECLASS_UNSPECIFIED) goto LAB_0011f18d;
    pUVar10 = pUVar10 + 1;
    goto LAB_0011f0aa;
  case 0xd:
    if (((pUVar10->node).nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) goto LAB_0011f18d;
    UVar6 = readValueAttributeComplete
                      ((UA_Server *)server_00,(UA_VariableNode *)(ulong)timestamps,(int)id + 0x20,
                       (UA_String *)v,v_00);
LAB_0011f069:
    if (UVar6 != 0) goto LAB_0011f18d;
    goto LAB_0011f1c8;
  case 0xe:
    if (((pUVar10->node).nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) goto LAB_0011f18d;
    pUVar10 = pUVar10 + 1;
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar8 = (UA_DataType *)0x13e6b0;
    break;
  case 0xf:
    if (((pUVar10->node).nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) goto LAB_0011f18d;
    pUVar10 = (UA_NodeStoreEntry *)((long)&pUVar10[1].node.nodeId.identifier + 8);
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar8 = (UA_DataType *)0x13e4a0;
    break;
  case 0x10:
    if (((pUVar10->node).nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) goto LAB_0011f18d;
    sVar1 = *(size_t *)&pUVar10[1].node.nodeClass;
    pvVar3 = *(void **)&pUVar10[1].node.browseName;
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    (v->value).data = pvVar3;
    (v->value).arrayLength = sVar1;
    (v->value).type = (UA_DataType *)0x13e4d0;
    (v->value).storageType = UA_VARIANT_DATA_NODELETE;
    *(byte *)v = *(byte *)v | 1;
    goto LAB_0011f1c8;
  case 0x11:
    if (((pUVar10->node).nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED)
    goto LAB_0011f18d;
    pUVar10 = (UA_NodeStoreEntry *)((long)&pUVar10[2].node.nodeId.identifier + 8);
    goto LAB_0011f0aa;
  case 0x12:
    if (((pUVar10->node).nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED)
    goto LAB_0011f18d;
    pUVar10 = (UA_NodeStoreEntry *)((long)&pUVar10[2].node.nodeId.identifier + 9);
LAB_0011f0aa:
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar8 = (UA_DataType *)0x13e410;
    break;
  case 0x13:
    if (((pUVar10->node).nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED)
    goto LAB_0011f18d;
    pUVar10 = (UA_NodeStoreEntry *)&pUVar10[2].node.nodeClass;
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar8 = (UA_DataType *)0x13e590;
    break;
  case 0x14:
    if (((pUVar10->node).nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED)
    goto LAB_0011f18d;
    pUVar10 = (UA_NodeStoreEntry *)&pUVar10[2].node.browseName;
    goto LAB_0011f19f;
  case 0x15:
    if (((pUVar10->node).nodeClass & UA_NODECLASS_METHOD) == UA_NODECLASS_UNSPECIFIED)
    goto LAB_0011f18d;
    pUVar10 = pUVar10 + 1;
    goto LAB_0011f19f;
  case 0x16:
    uVar4 = (char)(pUVar10->node).nodeClass & UA_NODECLASS_METHOD;
joined_r0x0011f0e9:
    if (uVar4 == UA_NODECLASS_UNSPECIFIED) {
LAB_0011f18d:
      *(byte *)v = *(byte *)v | 2;
      v->status = UVar6;
      return;
    }
    pUVar10 = (UA_NodeStoreEntry *)((long)&pUVar10[1].orig + 1);
LAB_0011f19f:
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar8 = UA_TYPES;
  }
  (v->value).type = pUVar8;
  (v->value).data = pUVar10;
LAB_0011f1c1:
  (v->value).storageType = UA_VARIANT_DATA_NODELETE;
LAB_0011f1c8:
  bVar5 = *(byte *)v | 1;
  *(byte *)v = bVar5;
  if (timestamps - UA_TIMESTAMPSTORETURN_SERVER < 2) {
    gettimeofday((timeval *)local_38,(__timezone_ptr_t)0x0);
    v->serverTimestamp = (long)local_38 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
    bVar5 = *(byte *)v | 8;
    *(byte *)v = bVar5;
  }
  if (id->attributeId == 0xd) {
    if ((timestamps & ~UA_TIMESTAMPSTORETURN_BOTH) == UA_TIMESTAMPSTORETURN_SERVER) {
      *(byte *)v = bVar5 & 0xeb;
    }
    else if ((bVar5 & 4) == 0) {
      UVar9 = UA_DateTime_now();
      v->sourceTimestamp = UVar9;
      *(byte *)v = *(byte *)v | 4;
    }
  }
  return;
}

Assistant:

void Service_Read_single(UA_Server *server, UA_Session *session,
                         const UA_TimestampsToReturn timestamps,
                         const UA_ReadValueId *id, UA_DataValue *v) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Read the attribute %i", id->attributeId);

    /* XML encoding is not supported */
    if(id->dataEncoding.name.length > 0 &&
       !UA_String_equal(&binEncoding, &id->dataEncoding.name)) {
           v->hasStatus = true;
           v->status = UA_STATUSCODE_BADDATAENCODINGUNSUPPORTED;
           return;
    }

    /* Index range for an attribute other than value */
    if(id->indexRange.length > 0 && id->attributeId != UA_ATTRIBUTEID_VALUE) {
        v->hasStatus = true;
        v->status = UA_STATUSCODE_BADINDEXRANGENODATA;
        return;
    }

    /* Get the node */
    const UA_Node *node = UA_NodeStore_get(server->nodestore, &id->nodeId);
    if(!node) {
        v->hasStatus = true;
        v->status = UA_STATUSCODE_BADNODEIDUNKNOWN;
        return;
    }

    /* Read the attribute */
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch(id->attributeId) {
    case UA_ATTRIBUTEID_NODEID:
        forceVariantSetScalar(&v->value, &node->nodeId, &UA_TYPES[UA_TYPES_NODEID]);
        break;
    case UA_ATTRIBUTEID_NODECLASS:
        forceVariantSetScalar(&v->value, &node->nodeClass, &UA_TYPES[UA_TYPES_NODECLASS]);
        break;
    case UA_ATTRIBUTEID_BROWSENAME:
        forceVariantSetScalar(&v->value, &node->browseName, &UA_TYPES[UA_TYPES_QUALIFIEDNAME]);
        break;
    case UA_ATTRIBUTEID_DISPLAYNAME:
        forceVariantSetScalar(&v->value, &node->displayName, &UA_TYPES[UA_TYPES_LOCALIZEDTEXT]);
        break;
    case UA_ATTRIBUTEID_DESCRIPTION:
        forceVariantSetScalar(&v->value, &node->description, &UA_TYPES[UA_TYPES_LOCALIZEDTEXT]);
        break;
    case UA_ATTRIBUTEID_WRITEMASK:
        forceVariantSetScalar(&v->value, &node->writeMask, &UA_TYPES[UA_TYPES_UINT32]);
        break;
    case UA_ATTRIBUTEID_USERWRITEMASK:
        forceVariantSetScalar(&v->value, &node->userWriteMask, &UA_TYPES[UA_TYPES_UINT32]);
        break;
    case UA_ATTRIBUTEID_ISABSTRACT:
        retval = readIsAbstractAttribute(node, &v->value);
        break;
    case UA_ATTRIBUTEID_SYMMETRIC:
        CHECK_NODECLASS(UA_NODECLASS_REFERENCETYPE);
        forceVariantSetScalar(&v->value, &((const UA_ReferenceTypeNode*)node)->symmetric,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_INVERSENAME:
        CHECK_NODECLASS(UA_NODECLASS_REFERENCETYPE);
        forceVariantSetScalar(&v->value, &((const UA_ReferenceTypeNode*)node)->inverseName,
                              &UA_TYPES[UA_TYPES_LOCALIZEDTEXT]);
        break;
    case UA_ATTRIBUTEID_CONTAINSNOLOOPS:
        CHECK_NODECLASS(UA_NODECLASS_VIEW);
        forceVariantSetScalar(&v->value, &((const UA_ViewNode*)node)->containsNoLoops,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_EVENTNOTIFIER:
        CHECK_NODECLASS(UA_NODECLASS_VIEW | UA_NODECLASS_OBJECT);
        forceVariantSetScalar(&v->value, &((const UA_ViewNode*)node)->eventNotifier,
                              &UA_TYPES[UA_TYPES_BYTE]);
        break;
    case UA_ATTRIBUTEID_VALUE:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        retval = readValueAttributeComplete(server, (const UA_VariableNode*)node,
                                            timestamps, &id->indexRange, v);
        break;
    case UA_ATTRIBUTEID_DATATYPE:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        forceVariantSetScalar(&v->value, &((const UA_VariableTypeNode*)node)->dataType,
                              &UA_TYPES[UA_TYPES_NODEID]);
        break;
    case UA_ATTRIBUTEID_VALUERANK:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        forceVariantSetScalar(&v->value, &((const UA_VariableTypeNode*)node)->valueRank,
                              &UA_TYPES[UA_TYPES_INT32]);
        break;
    case UA_ATTRIBUTEID_ARRAYDIMENSIONS:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        retval = readArrayDimensionsAttribute((const UA_VariableNode*)node, v);
        break;
    case UA_ATTRIBUTEID_ACCESSLEVEL:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->accessLevel,
                              &UA_TYPES[UA_TYPES_BYTE]);
        break;
    case UA_ATTRIBUTEID_USERACCESSLEVEL:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->userAccessLevel,
                              &UA_TYPES[UA_TYPES_BYTE]);
        break;
    case UA_ATTRIBUTEID_MINIMUMSAMPLINGINTERVAL:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->minimumSamplingInterval,
                              &UA_TYPES[UA_TYPES_DOUBLE]);
        break;
    case UA_ATTRIBUTEID_HISTORIZING:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->historizing,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_EXECUTABLE:
        CHECK_NODECLASS(UA_NODECLASS_METHOD);
        forceVariantSetScalar(&v->value, &((const UA_MethodNode*)node)->executable,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_USEREXECUTABLE:
        CHECK_NODECLASS(UA_NODECLASS_METHOD);
        forceVariantSetScalar(&v->value, &((const UA_MethodNode*)node)->userExecutable,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    default:
        retval = UA_STATUSCODE_BADATTRIBUTEIDINVALID;
    }

    /* Return error code when reading has failed */
    if(retval != UA_STATUSCODE_GOOD) {
        v->hasStatus = true;
        v->status = retval;
        return;
    }

    v->hasValue = true;

    /* Create server timestamp */
    if(timestamps == UA_TIMESTAMPSTORETURN_SERVER ||
       timestamps == UA_TIMESTAMPSTORETURN_BOTH) {
        v->serverTimestamp = UA_DateTime_now();
        v->hasServerTimestamp = true;
    }

    /* Handle source time stamp */
    if(id->attributeId == UA_ATTRIBUTEID_VALUE) {
        if (timestamps == UA_TIMESTAMPSTORETURN_SERVER ||
            timestamps == UA_TIMESTAMPSTORETURN_NEITHER) {
            v->hasSourceTimestamp = false;
            v->hasSourcePicoseconds = false;
        } else if(!v->hasSourceTimestamp) {
            v->sourceTimestamp = UA_DateTime_now();
            v->hasSourceTimestamp = true;
        }
    }
}